

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::setWindowFrameMargins(QWindow *this,QMarginsF margins)

{
  bool bVar1;
  QGraphicsWidgetPrivate *pQVar2;
  type pQVar3;
  QGraphicsWidgetPrivate *in_RDI;
  bool unchanged;
  QGraphicsWidgetPrivate *d;
  QGraphicsItem *in_stack_00000028;
  QMarginsF *rhs;
  
  rhs = (QMarginsF *)&stack0x00000008;
  pQVar2 = d_func((QGraphicsWidget *)0xa4ba75);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4ba8b);
  if ((bVar1) || (bVar1 = QMarginsF::isNull((QMarginsF *)in_RDI), !bVar1)) {
    QGraphicsWidgetPrivate::ensureWindowFrameMargins(in_RDI);
    std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator*
              ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)in_RDI);
    bVar1 = ::operator==((QMarginsF *)in_RDI,rhs);
    if (((pQVar2->setWindowFrameMargins & 1U) == 0) || (!bVar1)) {
      if (!bVar1) {
        QGraphicsItem::prepareGeometryChange(in_stack_00000028);
      }
      pQVar3 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator*
                         ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)in_RDI);
      pQVar3->m_left = rhs->m_left;
      pQVar3->m_top = rhs->m_top;
      pQVar3->m_right = rhs->m_right;
      pQVar3->m_bottom = rhs->m_bottom;
      pQVar2->setWindowFrameMargins = true;
    }
  }
  return;
}

Assistant:

void QGraphicsWidget::setWindowFrameMargins(QMarginsF margins)
{
    Q_D(QGraphicsWidget);

    if (!d->windowFrameMargins && margins.isNull())
        return;
    d->ensureWindowFrameMargins();
    const bool unchanged = *d->windowFrameMargins == margins;
    if (d->setWindowFrameMargins && unchanged)
        return;
    if (!unchanged)
        prepareGeometryChange();
    *d->windowFrameMargins = margins;
    d->setWindowFrameMargins = true;
}